

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

MutCommonExpr __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCommonExpr
          (BasicProblem<mp::BasicProblemParams<int>_> *this,NumericExpr expr)

{
  pointer pLVar1;
  pointer pLVar2;
  MutCommonExpr MVar3;
  NumericExpr expr_local;
  small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> local_90;
  
  pLVar1 = (this->linear_exprs_).super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->linear_exprs_).super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_90.m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_90.m_data.m_storage;
  local_90.m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity = 6
  ;
  local_90.m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_size = 0;
  expr_local = expr;
  std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::emplace_back<mp::LinearExpr>
            (&this->linear_exprs_,(LinearExpr *)&local_90);
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::~small_vector_base
            (&local_90);
  std::
  vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ::push_back(&this->nonlinear_exprs_,&expr_local);
  local_90.m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)CONCAT44(local_90.m_data.
                     super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr.
                     _4_4_,0x80000000);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&this->common_expr_positions_,(int *)&local_90);
  MVar3.
  super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>._8_8_ =
       ((long)pLVar2 - (long)pLVar1) / 0x78 & 0xffffffff;
  MVar3.
  super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ = this;
  return (MutCommonExpr)
         MVar3.
         super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>;
}

Assistant:

MutCommonExpr AddCommonExpr(NumericExpr expr) {
    std::size_t num_exprs = linear_exprs_.size();
    MP_ASSERT(num_exprs < MP_MAX_PROBLEM_ITEMS, "too many expressions");
    linear_exprs_.push_back(LinearExpr());
    nonlinear_exprs_.push_back(expr);
    common_expr_positions_.push_back(CommonExprPosDflt());
    return MutCommonExpr(this, static_cast<int>(num_exprs));
  }